

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Push
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this,iterator it)

{
  iterator iVar1;
  iterator iVar2;
  BuildsystemDirectoryStateType local_200;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_48;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *pcStack_40;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_30;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this_local;
  iterator it_local;
  
  pcStack_40 = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)it.Position;
  local_48 = it.Tree;
  local_30 = this;
  this_local = local_48;
  it_local.Tree = pcStack_40;
  memset(&local_200,0,0x1b8);
  cmState::BuildsystemDirectoryStateType::BuildsystemDirectoryStateType(&local_200);
  iVar2.Position = (PositionType)pcStack_40;
  iVar2.Tree = local_48;
  iVar2 = Push_impl(this,iVar2,&local_200);
  it_local.Position = (PositionType)iVar2.Tree;
  cmState::BuildsystemDirectoryStateType::~BuildsystemDirectoryStateType(&local_200);
  iVar1.Position = iVar2.Position;
  iVar1.Tree = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)it_local.Position;
  return iVar1;
}

Assistant:

iterator Push(iterator it)
  {
    return Push_impl(it, T());
  }